

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoteSamplingJSON.h
# Opt level: O2

void jaegertracing::sampling_manager::thrift::from_json
               (json *json,SamplingStrategyResponse *response)

{
  bool bVar1;
  const_reference this;
  const_iterator itr;
  key_type local_80 [2];
  const_iterator local_40;
  
  std::__cxx11::string::string((string *)local_80,"strategyType",(allocator *)&local_40);
  this = nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         ::at(json,local_80);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<jaegertracing::sampling_manager::thrift::SamplingStrategyType::type,_jaegertracing::sampling_manager::thrift::SamplingStrategyType::type,_0>
            (this);
  jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::__set_strategyType
            ((type)response);
  std::__cxx11::string::~string((string *)local_80);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[22]>(&local_40,json,(char (*) [22])"probabilisticSampling");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::cend((const_iterator *)local_80,json);
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=(&local_40,
                       (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_80);
  if (bVar1) {
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator->(&local_40);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy,_jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_80);
    jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::__set_probabilisticSampling
              ((ProbabilisticSamplingStrategy *)response);
    jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::
    ~ProbabilisticSamplingStrategy((ProbabilisticSamplingStrategy *)local_80);
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[21]>((const_iterator *)local_80,json,(char (*) [21])"rateLimitingSampling");
  local_40.m_object = (pointer)local_80[0]._M_dataplus._M_p;
  local_40.m_it.object_iterator._M_node = (_Base_ptr)local_80[0]._M_string_length;
  local_40.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)local_80[0].field_2._0_8_;
  local_40.m_it.primitive_iterator.m_it = local_80[0].field_2._8_8_;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::cend((const_iterator *)local_80,json);
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=(&local_40,
                       (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_80);
  if (bVar1) {
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator->(&local_40);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<jaegertracing::sampling_manager::thrift::RateLimitingSamplingStrategy,_jaegertracing::sampling_manager::thrift::RateLimitingSamplingStrategy,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_80);
    jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::__set_rateLimitingSampling
              ((RateLimitingSamplingStrategy *)response);
    jaegertracing::sampling_manager::thrift::RateLimitingSamplingStrategy::
    ~RateLimitingSamplingStrategy((RateLimitingSamplingStrategy *)local_80);
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[18]>((const_iterator *)local_80,json,(char (*) [18])"operationSampling");
  local_40.m_object = (pointer)local_80[0]._M_dataplus._M_p;
  local_40.m_it.primitive_iterator.m_it = local_80[0].field_2._8_8_;
  local_40.m_it.object_iterator._M_node = (_Base_ptr)local_80[0]._M_string_length;
  local_40.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)local_80[0].field_2._0_8_;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::cend((const_iterator *)local_80,json);
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=(&local_40,
                       (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_80);
  if (bVar1) {
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator->(&local_40);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies,_jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_80);
    jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::__set_operationSampling
              ((PerOperationSamplingStrategies *)response);
    jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies::
    ~PerOperationSamplingStrategies((PerOperationSamplingStrategies *)local_80);
  }
  return;
}

Assistant:

inline void from_json(const nlohmann::json& json,
                      SamplingStrategyResponse& response)
{
    FIELD_FROM_JSON(response, strategyType);
    auto itr = json.find("probabilisticSampling");
    if (itr != std::end(json)) {
        response.__set_probabilisticSampling(
            itr->get<ProbabilisticSamplingStrategy>());
    }
    itr = json.find("rateLimitingSampling");
    if (itr != std::end(json)) {
        response.__set_rateLimitingSampling(
            itr->get<RateLimitingSamplingStrategy>());
    }
    itr = json.find("operationSampling");
    if (itr != std::end(json)) {
        response.__set_operationSampling(
            itr->get<PerOperationSamplingStrategies>());
    }
}